

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::SimpleShaders::Run(SimpleShaders *this)

{
  GLuint GVar1;
  char *src_vs;
  char *src_fs;
  CallLogWrapper *this_00;
  undefined4 local_248;
  undefined4 local_244;
  GLint expected2 [12];
  GLenum props2 [12];
  GLint expected [11];
  GLenum props [11];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  long local_70;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  SimpleShaders *pSStack_10;
  GLuint program;
  SimpleShaders *this_local;
  
  pSStack_10 = this;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x16])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar1 = PIQBase::CreateProgram(&this->super_PIQBase,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  this_00 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  local_14 = GVar1;
  glu::CallLogWrapper::glBindAttribLocation(this_00,GVar1,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,local_14,0,"color");
  PIQBase::LinkProgram(&this->super_PIQBase,local_14);
  local_70 = 0;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)local_14);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)local_14,0x92e3,0x92f6,9,&local_70);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)local_14,0x92e4,0x92f5,1,&local_70);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)local_14,0x92e4,0x92f6,6,&local_70);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"color",&local_91);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe])
            (this,(ulong)GVar1,0x92e4,local_90,0,&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"position",&local_b9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe])
            (this,(ulong)GVar1,0x92e3,local_b8,0,&local_70);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"color",&local_e1);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar1,0x92e4,0,local_e0,&local_70);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"position",&local_109);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar1,0x92e3,0,local_108,&local_70);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"position",&local_131);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar1,0x92e3,local_130,0,&local_70);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"color",&local_159);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar1,0x92e4,local_158,0,&local_70);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  GVar1 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"color",&local_181);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x14])
            (this,(ulong)GVar1,0x92e4,local_180,0,&local_70);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  memcpy(expected + 10,&DAT_029dd6d0,0x2c);
  memset(props2 + 10,0,0x2c);
  props2[10] = 9;
  props2[0xb] = 0x8b52;
  expected[0] = 1;
  expected[6] = 1;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)local_14,0x92e3,0,0xb,expected + 10,0xb,props2 + 10,&local_70);
  memcpy(expected2 + 10,&DAT_029dd700,0x30);
  memset(&local_248,0,0x30);
  local_248 = 6;
  local_244 = 0x8b52;
  expected2[0] = 1;
  expected2[2] = 1;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)local_14,0x92e4,0,0xc,expected2 + 10,0xc,&local_248,&local_70);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,local_14)
  ;
  return local_70;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 9, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 6, error);

		VerifyGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, "color", 0, error);
		VerifyGetProgramResourceIndex(program, GL_PROGRAM_INPUT, "position", 0, error);

		VerifyGetProgramResourceName(program, GL_PROGRAM_OUTPUT, 0, "color", error);
		VerifyGetProgramResourceName(program, GL_PROGRAM_INPUT, 0, "position", error);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", 0, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", 0, error);

		VerifyGetProgramResourceLocationIndex(program, GL_PROGRAM_OUTPUT, "color", 0, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION,
						   GL_IS_PER_PATCH };
		GLint expected[] = { 9, GL_FLOAT_VEC4, 1, 0, 0, 0, 0, 0, 1, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 11, props, 11, expected, error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_LOCATION,
							GL_IS_PER_PATCH,
							GL_LOCATION_INDEX };
		GLint expected2[] = { 6, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0, 0, 0 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, 0, 12, props2, 12, expected2, error);

		glDeleteProgram(program);
		return error;
	}